

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpInit_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  
  puVar9 = (uint *)I->content;
  if ((int)puVar9[1] < (int)*puVar9) {
    if (*(void **)(puVar9 + 4) != (void *)0x0) {
      free(*(void **)(puVar9 + 4));
      puVar9 = (uint *)I->content;
      puVar9[4] = 0;
      puVar9[5] = 0;
    }
    if (*(long *)(puVar9 + 2) != 0) {
      lVar7 = 0;
      for (lVar8 = 0; pvVar4 = *(void **)(puVar9 + 2), lVar8 < (int)*puVar9; lVar8 = lVar8 + 1) {
        if (*(long *)((long)pvVar4 + lVar7) != 0) {
          arkFreeVec(ark_mem,(N_Vector *)((long)pvVar4 + lVar7));
          *(undefined8 *)(*(long *)((long)I->content + 8) + lVar7) = 0;
          puVar9 = (uint *)I->content;
        }
        lVar7 = lVar7 + 8;
      }
      free(pvVar4);
      puVar9 = (uint *)I->content;
      puVar9[2] = 0;
      puVar9[3] = 0;
    }
  }
  if (*(long *)(puVar9 + 4) == 0) {
    pvVar4 = malloc((long)(int)*puVar9 << 3);
    *(void **)(puVar9 + 4) = pvVar4;
    if (pvVar4 == (void *)0x0) goto LAB_00131a49;
  }
  uVar2 = *puVar9;
  if (*(long *)(puVar9 + 2) != 0) {
LAB_001319b5:
    uVar1 = puVar9[1];
    if ((int)puVar9[1] < (int)uVar2) {
      puVar9[1] = uVar2;
      uVar1 = uVar2;
    }
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)(*(long *)(puVar9 + 4) + uVar5 * 8) = 0;
    }
    iVar3 = N_VConstVectorArray(0,(ulong)uVar1,*(undefined8 *)(puVar9 + 2));
    if (iVar3 != 0) {
      return -0x1c;
    }
    pvVar4 = I->content;
    **(sunrealtype **)((long)pvVar4 + 0x10) = tnew;
    N_VScale(0x3ff0000000000000,ark_mem->yn,**(undefined8 **)((long)pvVar4 + 8));
    *(undefined4 *)((long)I->content + 0x18) = 1;
    return 0;
  }
  pvVar4 = malloc((long)(int)uVar2 << 3);
  *(void **)(puVar9 + 2) = pvVar4;
  if (pvVar4 != (void *)0x0) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      puVar9 = (uint *)I->content;
      uVar2 = *puVar9;
      if ((int)uVar2 <= lVar8) goto LAB_001319b5;
      *(undefined8 *)(*(long *)(puVar9 + 2) + lVar7) = 0;
      iVar3 = arkAllocVec(ark_mem,ark_mem->yn,(N_Vector *)(*(long *)((long)I->content + 8) + lVar7))
      ;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 8;
    } while (iVar3 != 0);
  }
LAB_00131a49:
  (*I->ops->free)(ark_mem,I);
  return -0x14;
}

Assistant:

int arkInterpInit_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
  {
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAX(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL)
  {
    LINT_THIST(I) = (sunrealtype*)malloc(LINT_NMAX(I) * sizeof(sunrealtype));
    if (LINT_THIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL)
  {
    LINT_YHIST(I) = (N_Vector*)malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
    for (i = 0; i < LINT_NMAX(I); i++)
    {
      LINT_YJ(I, i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I, i))))
      {
        arkInterpFree(ark_mem, I);
        return (ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necessary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) { LINT_NMAXALLOC(I) = LINT_NMAX(I); }

  /* zero out history (to be safe) */
  for (i = 0; i < LINT_NMAXALLOC(I); i++) { LINT_TJ(I, i) = SUN_RCONST(0.0); }
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), SUN_RCONST(0.0), LINT_YHIST(I)))
  {
    return (ARK_VECTOROP_ERR);
  }

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I, 0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I, 0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return (ARK_SUCCESS);
}